

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

Temp * __thiscall IR::IRBuilder::newTemp(IRBuilder *this,string *type)

{
  Function *args;
  Temp *pTVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args_00;
  uint local_dc;
  string local_d8;
  string local_b8;
  string *local_98;
  string *type_local;
  IRBuilder *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_2
  local_80;
  basic_string_view<char> local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_1
  local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_1
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_unsigned_int>
  *vargs;
  char *local_40;
  string *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_1
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_1
  *local_10;
  
  local_98 = type;
  type_local = (string *)this;
  std::__cxx11::string::string((string *)&local_b8,(string *)type);
  args = this->function_;
  local_dc = args->uniqueTempCount_;
  args->uniqueTempCount_ = local_dc + 1;
  local_38 = &local_d8;
  local_40 = "yy{}";
  vargs = (format_arg_store<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_unsigned_int>
           *)&local_dc;
  local_68.named_args.data =
       (named_arg_info<char> *)
       fmt::v7::detail::make_args_checked<unsigned_int,char[5],char>
                 ((format_arg_store<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_unsigned_int>
                   *)"yy{}",(detail *)vargs,(char (*) [5])(ulong)(local_dc + 1),
                  (remove_reference_t<unsigned_int> *)args);
  local_50 = &local_68;
  local_78 = fmt::v7::to_string_view<char,_0>(local_40);
  local_28 = (basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
              *)&this_local;
  local_30 = local_50;
  local_20 = local_50;
  local_10 = local_50;
  local_18 = local_28;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  ::basic_format_args(local_28,2,
                      (value<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                       *)&local_50->string);
  format_str.size_ = (size_t)this_local;
  format_str.data_ = (char *)local_78.size_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  .field_1.values_ = in_R9.values_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  .desc_ = (unsigned_long_long)local_80.values_;
  fmt::v7::detail::vformat_abi_cxx11_(&local_d8,(detail *)local_78.data_,format_str,args_00);
  pTVar1 = getTemp(this,&local_b8,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  return pTVar1;
}

Assistant:

const Temp* IRBuilder::newTemp(std::string type) {
  return getTemp(std::move(type),
                 fmt::format("yy{}", function_->uniqueTempCount_++));
}